

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestStartCommand::InitialCheckout(cmCTestStartCommand *this,ostream *ofs,string *sourceDir)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *command;
  undefined1 local_220 [8];
  cmCTestVC vc;
  string local_90;
  string *local_70;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue initialCheckoutCommand;
  string *sourceDir_local;
  ostream *ofs_local;
  cmCTestStartCommand *this_local;
  
  pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
  initialCheckoutCommand.Value = sourceDir;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CTEST_CHECKOUT_COMMAND",&local_51);
  local_30 = cmMakefile::GetDefinition(pcVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar2 = cmValue::operator_cast_to_bool(&local_30);
  if (!bVar2) {
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"CTEST_CVS_CHECKOUT",(allocator<char> *)&vc.field_0x187);
    local_70 = (string *)cmMakefile::GetDefinition(pcVar1,&local_90);
    local_30 = (cmValue)local_70;
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&vc.field_0x187);
  }
  bVar2 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar2) {
    cmCTestVC::cmCTestVC((cmCTestVC *)local_220,(this->super_cmCTestCommand).CTest,ofs);
    cmCTestVC::SetSourceDirectory((cmCTestVC *)local_220,initialCheckoutCommand.Value);
    command = cmValue::operator*[abi_cxx11_(&local_30);
    bVar2 = cmCTestVC::InitialCheckout((cmCTestVC *)local_220,command);
    if (!bVar2) {
      this_local._7_1_ = 0;
    }
    cmCTestVC::~cmCTestVC((cmCTestVC *)local_220);
    if (!bVar2) goto LAB_0020b295;
  }
  this_local._7_1_ = 1;
LAB_0020b295:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestStartCommand::InitialCheckout(std::ostream& ofs,
                                          std::string const& sourceDir)
{
  // Use the user-provided command to create the source tree.
  cmValue initialCheckoutCommand =
    this->Makefile->GetDefinition("CTEST_CHECKOUT_COMMAND");
  if (!initialCheckoutCommand) {
    initialCheckoutCommand =
      this->Makefile->GetDefinition("CTEST_CVS_CHECKOUT");
  }
  if (initialCheckoutCommand) {
    // Use a generic VC object to run and log the command.
    cmCTestVC vc(this->CTest, ofs);
    vc.SetSourceDirectory(sourceDir);
    if (!vc.InitialCheckout(*initialCheckoutCommand)) {
      return false;
    }
  }
  return true;
}